

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitDataDrop(PrintExpressionContents *this,DataDrop *curr)

{
  prepareColor(this->o);
  std::operator<<(this->o,"data.drop");
  Colors::normal(this->o);
  std::operator<<(this->o,' ');
  Name::print(&curr->segment,this->o);
  return;
}

Assistant:

void visitDataDrop(DataDrop* curr) {
    prepareColor(o);
    o << "data.drop";
    restoreNormalColor(o);
    o << ' ';
    curr->segment.print(o);
  }